

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenGlobalRef
BinaryenAddGlobal(BinaryenModuleRef module,char *name,BinaryenType type,bool mutable_,
                 BinaryenExpressionRef init)

{
  Global *curr;
  IString *this;
  undefined1 reuse;
  string_view sVar1;
  
  reuse = mutable_;
  curr = (Global *)operator_new(0x50);
  (curr->super_Importable).super_Named.name.super_IString.str._M_len = 0;
  (curr->super_Importable).super_Named.name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(curr->super_Importable).super_Named.hasExplicitName = 0;
  (curr->super_Importable).module.super_IString.str._M_len = 0;
  (curr->super_Importable).module.super_IString.str._M_str = (char *)0x0;
  (curr->super_Importable).base.super_IString.str._M_len = 0;
  (curr->super_Importable).base.super_IString.str._M_str = (char *)0x0;
  (curr->type).id = 0;
  curr->init = (Expression *)0x0;
  *(undefined8 *)&curr->mutable_ = 0;
  this = (IString *)strlen(name);
  sVar1._M_str = (char *)0x0;
  sVar1._M_len = (size_t)name;
  sVar1 = wasm::IString::interned(this,sVar1,(bool)reuse);
  (curr->super_Importable).super_Named.name.super_IString.str = sVar1;
  (curr->super_Importable).super_Named.hasExplicitName = true;
  (curr->type).id = type;
  curr->mutable_ = mutable_;
  curr->init = init;
  wasm::Module::addGlobal(module,curr);
  return curr;
}

Assistant:

BinaryenGlobalRef BinaryenAddGlobal(BinaryenModuleRef module,
                                    const char* name,
                                    BinaryenType type,
                                    bool mutable_,
                                    BinaryenExpressionRef init) {
  auto* ret = new Global();
  ret->setExplicitName(name);
  ret->type = Type(type);
  ret->mutable_ = mutable_;
  ret->init = (Expression*)init;
  ((Module*)module)->addGlobal(ret);
  return ret;
}